

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

void __thiscall QMdiSubWindow::mouseMoveEvent(QMdiSubWindow *this,QMouseEvent *mouseEvent)

{
  SubControl SVar1;
  int iVar2;
  int iVar3;
  QMdiSubWindowPrivate *this_00;
  QWidget *pQVar4;
  QWidgetData *pQVar5;
  QRect QVar6;
  char cVar7;
  undefined4 uVar8;
  uint uVar9;
  SubControl SVar10;
  int iVar11;
  Operation OVar12;
  QStyle *pQVar13;
  QProxyStyle *this_01;
  long lVar14;
  QPoint QVar15;
  ulong uVar16;
  ulong uVar17;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double extraout_XMM1_Qa;
  double extraout_XMM1_Qa_00;
  double extraout_XMM1_Qa_01;
  undefined1 auVar23 [16];
  QRect QVar24;
  QRegion hoverRegion;
  QStyleOptionTitleBar options;
  QStyleOptionTitleBar titleBarOptions;
  QRegion local_120;
  undefined1 local_118 [16];
  undefined1 *local_108;
  undefined1 *puStack_100;
  undefined1 *local_f8;
  QPalettePrivate *pQStack_f0;
  undefined1 *local_e8;
  QObject *pQStack_e0;
  undefined1 *local_d8;
  QArrayData *pQStack_d0;
  char16_t *local_c8;
  undefined1 *puStack_c0;
  QIcon local_b8;
  undefined1 *puStack_b0;
  undefined1 local_a8 [16];
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  QPalettePrivate *pQStack_80;
  undefined1 *local_78;
  QObject *pQStack_70;
  undefined1 *local_68;
  QArrayData *pQStack_60;
  char16_t *local_58;
  undefined1 *puStack_50;
  QIcon local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8;
  if (*(long *)&(this_00->super_QWidgetPrivate).field_0x10 == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QWidget::mouseMoveEvent(&this->super_QWidget,mouseEvent);
      return;
    }
  }
  else {
    if (this_00->currentOperation == None) {
      local_b8.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
      local_c8 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
      local_d8 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_d0 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      local_e8 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_e0 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      local_f8 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_f0 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_108 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_100 = &DAT_aaaaaaaaaaaaaaaa;
      local_118._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_118._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QMdiSubWindowPrivate::titleBarOptions((QStyleOptionTitleBar *)local_118,this_00);
      SVar1 = this_00->hoveredSubControl;
      uVar8 = QEventPoint::position();
      auVar23._0_8_ =
           (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
           extraout_XMM1_Qa;
      auVar23._8_8_ =
           (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
           extraout_XMM0_Qa;
      auVar23 = minpd(_DAT_0066f5d0,auVar23);
      auVar18._8_8_ = -(ulong)(-2147483648.0 < auVar23._8_8_);
      auVar18._0_8_ = -(ulong)(-2147483648.0 < auVar23._0_8_);
      uVar9 = movmskpd(uVar8,auVar18);
      uVar17 = 0x8000000000000000;
      if ((uVar9 & 1) != 0) {
        uVar17 = (ulong)(uint)(int)auVar23._0_8_ << 0x20;
      }
      uVar16 = 0x80000000;
      if ((uVar9 & 2) != 0) {
        uVar16 = (ulong)(uint)(int)auVar23._8_8_;
      }
      local_120.d = (QRegionData *)(uVar16 | uVar17);
      pQVar4 = *(QWidget **)&(this_00->super_QWidgetPrivate).field_0x8;
      local_48.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_60 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_70 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_80 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
      local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QMdiSubWindowPrivate::titleBarOptions((QStyleOptionTitleBar *)local_a8,this_00);
      pQVar13 = QWidget::style(pQVar4);
      SVar10 = (**(code **)(*(long *)pQVar13 + 0xd0))
                         (pQVar13,5,(QStyleOptionTitleBar *)local_a8,&local_120,pQVar4);
      QIcon::~QIcon(&local_48);
      if (pQStack_60 != (QArrayData *)0x0) {
        LOCK();
        (pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQStack_60,2,0x10);
        }
      }
      QStyleOption::~QStyleOption((QStyleOption *)local_a8);
      this_00->hoveredSubControl = SVar10;
      local_120.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      QRegion::QRegion(&local_120);
      QVar6.x2.m_i = local_a8._8_4_;
      QVar6.y2.m_i = local_a8._12_4_;
      QVar6.x1.m_i = local_a8._0_4_;
      QVar6.y1.m_i = local_a8._4_4_;
      QVar24.x2.m_i = local_a8._8_4_;
      QVar24.y2.m_i = local_a8._12_4_;
      QVar24.x1.m_i = local_a8._0_4_;
      QVar24.y1.m_i = local_a8._4_4_;
      if (((SVar1 & ~SC_TitleBarLabel) != SC_None) &&
         (QVar24 = QVar6, SVar1 != this_00->hoveredSubControl)) {
        pQVar13 = QWidget::style(&this->super_QWidget);
        local_a8 = (**(code **)(*(long *)pQVar13 + 0xd8))(pQVar13,5,local_118,SVar1,this);
        QRegion::operator+=(&local_120,(QRect *)local_a8);
        QVar24 = (QRect)local_a8;
      }
      local_a8 = (undefined1  [16])QVar24;
      if (this_00->hoveredSubControl != SVar1 &&
          (this_00->hoveredSubControl & ~SC_TitleBarLabel) != SC_None) {
        pQVar13 = QWidget::style(&this->super_QWidget);
        QVar24 = (QRect)(**(code **)(*(long *)pQVar13 + 0xd8))
                                  (pQVar13,5,local_118,this_00->hoveredSubControl,this);
        local_a8 = (undefined1  [16])QVar24;
        QRegion::operator+=(&local_120,(QRect *)local_a8);
      }
      pQVar13 = QWidget::style(&this->super_QWidget);
      this_01 = (QProxyStyle *)QMetaObject::cast((QObject *)&QProxyStyle::staticMetaObject);
      if (this_01 != (QProxyStyle *)0x0) {
        pQVar13 = QProxyStyle::baseStyle(this_01);
      }
      lVar14 = (**(code **)(*(long *)pQVar13 + 8))(pQVar13,"QMacStyle");
      if (lVar14 != 0) {
        cVar7 = QRegion::isEmpty();
        if (cVar7 == '\0') {
          pQVar5 = (this->super_QWidget).data;
          iVar2 = (pQVar5->crect).x2.m_i;
          iVar3 = (pQVar5->crect).x1.m_i;
          iVar11 = QMdiSubWindowPrivate::titleBarHeight(this_00,(QStyleOptionTitleBar *)local_118);
          QRegion::QRegion((QRegion *)local_a8,0,0,(iVar2 - iVar3) + 1,iVar11,Rectangle);
          QRegion::operator+=(&local_120,(QRegion *)local_a8);
          QRegion::~QRegion((QRegion *)local_a8);
        }
      }
      cVar7 = QRegion::isEmpty();
      if (cVar7 == '\0') {
        QWidget::update(&this->super_QWidget,&local_120);
      }
      QRegion::~QRegion(&local_120);
      QIcon::~QIcon(&local_b8);
      if (pQStack_d0 != (QArrayData *)0x0) {
        LOCK();
        (pQStack_d0->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQStack_d0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQStack_d0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQStack_d0,2,0x10);
        }
      }
      QStyleOption::~QStyleOption((QStyleOption *)local_118);
    }
    if ((((byte)mouseEvent[0x44] & 1) == 0) && (this_00->isInInteractiveMode != true)) {
      uVar8 = QEventPoint::position();
      auVar21._0_8_ =
           (double)((ulong)extraout_XMM1_Qa_01 & 0x8000000000000000 | 0x3fe0000000000000) +
           extraout_XMM1_Qa_01;
      auVar21._8_8_ =
           (double)((ulong)extraout_XMM0_Qa_01 & 0x8000000000000000 | 0x3fe0000000000000) +
           extraout_XMM0_Qa_01;
      auVar23 = minpd(_DAT_0066f5d0,auVar21);
      auVar22._8_8_ = -(ulong)(-2147483648.0 < auVar23._8_8_);
      auVar22._0_8_ = -(ulong)(-2147483648.0 < auVar23._0_8_);
      uVar9 = movmskpd(uVar8,auVar22);
      uVar17 = 0x8000000000000000;
      if ((uVar9 & 1) != 0) {
        uVar17 = (ulong)(uint)(int)auVar23._0_8_ << 0x20;
      }
      uVar16 = 0x80000000;
      if ((uVar9 & 2) != 0) {
        uVar16 = (ulong)(uint)(int)auVar23._8_8_;
      }
      local_a8._0_8_ = uVar16 | uVar17;
      OVar12 = QMdiSubWindowPrivate::getOperation(this_00,(QPoint *)local_a8);
      this_00->currentOperation = OVar12;
      if (((Move < OVar12) && (this_00->resizeEnabled != true)) ||
         ((OVar12 == Move && (this_00->moveEnabled == false)))) {
        this_00->currentOperation = None;
      }
      QMdiSubWindowPrivate::updateCursor(this_00);
    }
    else if (((Move < this_00->currentOperation) && (this_00->resizeEnabled != false)) ||
            ((this_00->currentOperation == Move && (this_00->moveEnabled == true)))) {
      pQVar4 = *(QWidget **)(*(long *)&(this->super_QWidget).field_0x8 + 0x10);
      uVar8 = QEventPoint::globalPosition();
      auVar19._0_8_ =
           (double)((ulong)extraout_XMM1_Qa_00 & 0x8000000000000000 | 0x3fe0000000000000) +
           extraout_XMM1_Qa_00;
      auVar19._8_8_ =
           (double)((ulong)extraout_XMM0_Qa_00 & 0x8000000000000000 | 0x3fe0000000000000) +
           extraout_XMM0_Qa_00;
      auVar23 = minpd(_DAT_0066f5d0,auVar19);
      auVar20._8_8_ = -(ulong)(-2147483648.0 < auVar23._8_8_);
      auVar20._0_8_ = -(ulong)(-2147483648.0 < auVar23._0_8_);
      uVar9 = movmskpd(uVar8,auVar20);
      uVar17 = 0x8000000000000000;
      if ((uVar9 & 1) != 0) {
        uVar17 = (ulong)(uint)(int)auVar23._0_8_ << 0x20;
      }
      uVar16 = 0x80000000;
      if ((uVar9 & 2) != 0) {
        uVar16 = (ulong)(uint)(int)auVar23._8_8_;
      }
      local_118._0_8_ = uVar16 | uVar17;
      QVar15 = QWidget::mapFromGlobal(pQVar4,(QPoint *)local_118);
      local_a8._0_8_ = QVar15;
      QMdiSubWindowPrivate::setNewGeometry(this_00,(QPoint *)local_a8);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindow::mouseMoveEvent(QMouseEvent *mouseEvent)
{
    if (!parent()) {
        QWidget::mouseMoveEvent(mouseEvent);
        return;
    }

    Q_D(QMdiSubWindow);
    // No update needed if we're in a move/resize operation.
    if (!d->isMoveOperation() && !d->isResizeOperation()) {
        // Find previous and current hover region.
        const QStyleOptionTitleBar options = d->titleBarOptions();
        QStyle::SubControl oldHover = d->hoveredSubControl;
        d->hoveredSubControl = d->getSubControl(mouseEvent->position().toPoint());
        QRegion hoverRegion;
        if (isHoverControl(oldHover) && oldHover != d->hoveredSubControl)
            hoverRegion += style()->subControlRect(QStyle::CC_TitleBar, &options, oldHover, this);
        if (isHoverControl(d->hoveredSubControl) && d->hoveredSubControl != oldHover) {
            hoverRegion += style()->subControlRect(QStyle::CC_TitleBar, &options,
                    d->hoveredSubControl, this);
        }

        if (isMacStyle(style()) && !hoverRegion.isEmpty())
            hoverRegion += QRegion(0, 0, width(), d->titleBarHeight(options));

        if (!hoverRegion.isEmpty())
            update(hoverRegion);
    }

    if ((mouseEvent->buttons() & Qt::LeftButton) || d->isInInteractiveMode) {
        if ((d->isResizeOperation() && d->resizeEnabled) || (d->isMoveOperation() && d->moveEnabled)) {
            // As setNewGeometry moves the window, it invalidates the pos() value of any mouse move events that are
            // currently queued in the event loop. Map to parent using globalPos() instead.
            d->setNewGeometry(parentWidget()->mapFromGlobal(mouseEvent->globalPosition().toPoint()));
        }
        return;
    }

    // Do not resize/move if not allowed.
    d->currentOperation = d->getOperation(mouseEvent->position().toPoint());
    if ((d->isResizeOperation() && !d->resizeEnabled) || (d->isMoveOperation() && !d->moveEnabled))
        d->currentOperation = QMdiSubWindowPrivate::None;
    d->updateCursor();
}